

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O1

void __thiscall avro::Node::addName(Node *this,string *name)

{
  Name local_58;
  
  checkLock(this);
  Name::Name(&local_58,name);
  (*this->_vptr_Node[0x10])(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.simpleName_._M_dataplus._M_p != &local_58.simpleName_.field_2) {
    operator_delete(local_58.simpleName_._M_dataplus._M_p,
                    local_58.simpleName_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.ns_._M_dataplus._M_p != &local_58.ns_.field_2) {
    operator_delete(local_58.ns_._M_dataplus._M_p,local_58.ns_.field_2._M_allocated_capacity + 1);
  }
  (*this->_vptr_Node[0x13])(this,name);
  return;
}

Assistant:

void addName(const std::string &name) {
        checkLock();
        checkName(name);
        doAddName(name);
    }